

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

int16_t mpack_expect_i16(mpack_reader_t *reader)

{
  anon_union_8_8_6320e492_for_v aVar1;
  mpack_tag_t mVar2;
  
  mVar2 = mpack_read_tag(reader);
  aVar1 = mVar2.v;
  if (mVar2.type == mpack_type_int) {
    if ((long)mVar2.v._0_2_ == aVar1.u) goto LAB_00106803;
  }
  else if ((mVar2.type == mpack_type_uint) && (aVar1.u < 0x8000)) goto LAB_00106803;
  mpack_reader_flag_error(reader,mpack_error_type);
  aVar1.u = 0;
LAB_00106803:
  return (int16_t)aVar1.i;
}

Assistant:

int16_t mpack_expect_i16(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_uint) {
        if (var.v.u <= INT16_MAX)
            return (int16_t)var.v.u;
    } else if (var.type == mpack_type_int) {
        if (var.v.i >= INT16_MIN && var.v.i <= INT16_MAX)
            return (int16_t)var.v.i;
    }
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0;
}